

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlElementPtr pxVar1;
  _xmlElementContent *p_Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  xmlNodePtr node;
  xmlValidState *pxVar6;
  xmlRegExecCtxtPtr pxVar7;
  uint uVar8;
  uint uVar9;
  xmlChar *pxVar10;
  _xmlElementContent *p_Var11;
  int local_40;
  int extsubset;
  xmlChar *local_38;
  
  extsubset = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  uVar5 = 1;
  if ((0 < ctxt->vstateNr) && (pxVar6 = ctxt->vstate, pxVar6 != (xmlValidState *)0x0)) {
    pxVar1 = pxVar6->elemDecl;
    uVar5 = 1;
    bVar3 = true;
    if (pxVar1 != (xmlElementPtr)0x0) {
      switch(pxVar1->etype) {
      case XML_ELEMENT_TYPE_MIXED:
        p_Var11 = pxVar1->content;
        if ((p_Var11 == (xmlElementContentPtr)0x0) || (p_Var11->type != XML_ELEMENT_CONTENT_PCDATA))
        {
          local_38 = xmlSplitQName3(qname,&local_40);
          if (local_38 == (xmlChar *)0x0) {
            if (p_Var11 == (xmlElementContentPtr)0x0) goto LAB_0015b382;
            do {
              if (p_Var11->type == XML_ELEMENT_CONTENT_OR) {
                p_Var2 = p_Var11->c1;
                if ((p_Var2 == (_xmlElementContent *)0x0) ||
                   (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT)) {
                  if ((p_Var2 == (_xmlElementContent *)0x0) ||
                     (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA)) break;
                }
                else if (p_Var2->prefix == (xmlChar *)0x0) {
                  pxVar10 = p_Var2->name;
                  goto LAB_0015b348;
                }
              }
              else {
                if (p_Var11->type != XML_ELEMENT_CONTENT_ELEMENT) break;
                if (p_Var11->prefix == (xmlChar *)0x0) {
                  pxVar10 = p_Var11->name;
LAB_0015b348:
                  iVar4 = xmlStrEqual(pxVar10,qname);
                  if (iVar4 != 0) goto LAB_0015b3c7;
                }
              }
              p_Var11 = p_Var11->c2;
            } while (p_Var11 != (_xmlElementContent *)0x0);
          }
          else {
            if (p_Var11 == (xmlElementContentPtr)0x0) {
LAB_0015b382:
              uVar5 = 0;
              goto LAB_0015b385;
            }
            do {
              if (p_Var11->type == XML_ELEMENT_CONTENT_OR) {
                p_Var2 = p_Var11->c1;
                if ((p_Var2 == (_xmlElementContent *)0x0) ||
                   (p_Var2->type != XML_ELEMENT_CONTENT_ELEMENT)) {
                  if ((p_Var2 == (_xmlElementContent *)0x0) ||
                     (p_Var2->type != XML_ELEMENT_CONTENT_PCDATA)) goto LAB_0015b38d;
                }
                else if ((p_Var2->prefix != (xmlChar *)0x0) &&
                        (iVar4 = xmlStrncmp(p_Var2->prefix,qname,local_40), iVar4 == 0)) {
                  pxVar10 = p_Var11->c1->name;
                  goto LAB_0015b288;
                }
              }
              else {
                if (p_Var11->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_0015b38d:
                  uVar5 = 0;
                  xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_MIXED_CORRUPT,2,(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0,0,"Internal: MIXED struct corrupted\n"
                                ,0);
                  bVar3 = true;
                  goto switchD_0015b078_caseD_2;
                }
                if ((p_Var11->prefix != (xmlChar *)0x0) &&
                   (iVar4 = xmlStrncmp(p_Var11->prefix,qname,local_40), iVar4 == 0)) {
                  pxVar10 = p_Var11->name;
LAB_0015b288:
                  iVar4 = xmlStrEqual(pxVar10,local_38);
                  if (iVar4 != 0) goto LAB_0015b3c7;
                }
              }
              p_Var11 = p_Var11->c2;
            } while (p_Var11 != (_xmlElementContent *)0x0);
          }
        }
      case XML_ELEMENT_TYPE_UNDEFINED:
      case XML_ELEMENT_TYPE_EMPTY:
        bVar3 = true;
        uVar5 = 0;
        break;
      case XML_ELEMENT_TYPE_ELEMENT:
        if (pxVar6->exec != (xmlRegExecCtxtPtr)0x0) {
          uVar5 = xmlRegExecPushString(pxVar6->exec,qname,(void *)0x0);
          if (uVar5 == 0xfffffffb) {
            xmlVErrMemory(ctxt);
            uVar5 = 0xfffffffb;
            bVar3 = false;
          }
          else {
            uVar5 = ~uVar5 >> 0x1f;
LAB_0015b385:
            bVar3 = true;
          }
        }
      }
    }
switchD_0015b078_caseD_2:
    if (!bVar3) {
      return 0;
    }
  }
  node = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
  iVar4 = ctxt->vstateMax;
  if (ctxt->vstateNr < iVar4) {
LAB_0015b0fe:
    pxVar6 = ctxt->vstateTab + ctxt->vstateNr;
    ctxt->vstate = pxVar6;
    pxVar6->elemDecl = (xmlElementPtr)node;
    pxVar6->node = elem;
    if ((node != (xmlNodePtr)0x0) && (*(int *)&node->ns == 4)) {
      if (node->psvi == (void *)0x0) {
        xmlValidBuildContentModel(ctxt,(xmlElementPtr)node);
      }
      if ((xmlRegexpPtr)node->psvi == (xmlRegexpPtr)0x0) {
        ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
        xmlDoErrValid(ctxt,node,XML_ERR_INTERNAL_ERROR,2,elem->name,(xmlChar *)0x0,(xmlChar *)0x0,0,
                      "Failed to build content model regexp for %s\n",elem->name,0,0);
      }
      else {
        pxVar7 = xmlRegNewExecCtxt((xmlRegexpPtr)node->psvi,(xmlRegExecCallbacks)0x0,(void *)0x0);
        ctxt->vstateTab[ctxt->vstateNr].exec = pxVar7;
        if (pxVar7 == (xmlRegExecCtxtPtr)0x0) goto LAB_0015b16a;
      }
    }
    ctxt->vstateNr = ctxt->vstateNr + 1;
  }
  else {
    if (iVar4 < 1) {
      uVar9 = 10;
    }
    else {
      uVar9 = 0xffffffff;
      if (iVar4 < 1000000000) {
        uVar8 = iVar4 + 1U >> 1;
        uVar9 = uVar8 + iVar4;
        if ((int)(1000000000 - uVar8) < iVar4) {
          uVar9 = 1000000000;
        }
      }
    }
    if ((-1 < (int)uVar9) &&
       (pxVar6 = (xmlValidState *)(*xmlRealloc)(ctxt->vstateTab,(ulong)uVar9 * 0x18),
       pxVar6 != (xmlValidState *)0x0)) {
      ctxt->vstateTab = pxVar6;
      ctxt->vstateMax = uVar9;
      goto LAB_0015b0fe;
    }
LAB_0015b16a:
    xmlVErrMemory(ctxt);
  }
  return uVar5;
LAB_0015b3c7:
  bVar3 = true;
  uVar5 = 1;
  goto switchD_0015b078_caseD_2;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}